

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O2

void __thiscall
ReindexCommand::ReindexCommand
          (ReindexCommand *this,string *dataset_id,
          vector<IndexType,_std::allocator<IndexType>_> *types)

{
  std::__cxx11::string::string((string *)this,(string *)dataset_id);
  std::vector<IndexType,_std::allocator<IndexType>_>::vector(&this->types_,types);
  return;
}

Assistant:

ReindexCommand(const std::string &dataset_id,
                   const std::vector<IndexType> &types)
        : dataset_id_(dataset_id), types_(types) {}